

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadHeap.cpp
# Opt level: O0

void __thiscall QuadHeap::QuadHeap(QuadHeap *this)

{
  int local_40;
  int local_3c;
  int y;
  int x;
  QuadHeap *local_10;
  QuadHeap *this_local;
  
  local_10 = this;
  Coordinated::Coordinated((Coordinated *)this);
  Entity::Entity(&this->super_Entity,&PTR_PTR_00157480,Vec2d::ORIGIN,Vec2d::ORIGIN);
  Drawable::Drawable(&this->super_Drawable,&PTR_construction_vtable_80__00157490);
  Collidable::Collidable(&this->super_Collidable);
  *(undefined ***)&this->super_Entity = &PTR__QuadHeap_00157360;
  *(undefined ***)&this->super_Entity = &PTR__QuadHeap_00157360;
  this->super_Drawable = (Drawable)&PTR__QuadHeap_00157410;
  (this->super_Collidable)._vptr_Collidable = (_func_int **)&PTR_collidesWithQuads_00157468;
  std::vector<Quad_*,_std::allocator<Quad_*>_>::vector(&this->quads);
  memset(&y,0,0x18);
  std::vector<Quad_*,_std::allocator<Quad_*>_>::vector
            ((vector<Quad_*,_std::allocator<Quad_*>_> *)&y);
  std::vector<Quad_*,_std::allocator<Quad_*>_>::operator=
            (&this->quads,(vector<Quad_*,_std::allocator<Quad_*>_> *)&y);
  std::vector<Quad_*,_std::allocator<Quad_*>_>::~vector
            ((vector<Quad_*,_std::allocator<Quad_*>_> *)&y);
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 0x14; local_40 = local_40 + 1) {
      this->quadState[local_3c][local_40] = false;
    }
  }
  return;
}

Assistant:

QuadHeap::QuadHeap(): Entity(Vec2d::ORIGIN, Vec2d::ORIGIN) {
    quads = vector<Quad*>();
    
    for (int x=0; x<10; x++) {
        for (int y=0; y<20; y++) {
            quadState[x][y] = false;
        }
    }
}